

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_surface.cpp
# Opt level: O2

Reals __thiscall
Omega_h::tri_vert_normal_weights(Omega_h *this,Mesh *mesh,Adj *surf_verts2tris,LOs *tri2surf_tri)

{
  char cVar1;
  int iVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  Int i_2;
  LO LVar7;
  pointer psVar8;
  long lVar9;
  void *extraout_RDX;
  long lVar10;
  long lVar11;
  ulong uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  Reals RVar15;
  undefined1 local_2b8 [16];
  double local_2a8;
  ulong local_2a0;
  undefined1 local_298 [16];
  double local_288;
  Write<double> weights;
  Write<signed_char> local_260;
  Reals coords;
  LOs fv2v;
  Vector<3> v;
  pointer local_218;
  pointer psStack_210;
  pointer psStack_208;
  Few<int,_3> ffv2v;
  pointer local_1f0;
  undefined4 local_1e8;
  Adj local_1e0;
  Write<int> local_1b0;
  Write<signed_char> local_1a0;
  Write<int> local_190;
  Write<signed_char> local_180;
  Matrix<3,_3> ffv2p;
  Vector<3> c;
  Adj local_110;
  Write<int> local_e0;
  Write<double> local_d0;
  Write<int> local_c0;
  Write<double> local_b0;
  type func;
  
  LVar7 = Graph::nnodes(&surf_verts2tris->super_Graph);
  local_2a0 = CONCAT44(local_2a0._4_4_,LVar7);
  Mesh::ask_verts_of((Mesh *)&fv2v,(Int)mesh);
  Mesh::coords((Mesh *)&coords);
  LVar7 = Graph::nedges(&surf_verts2tris->super_Graph);
  std::__cxx11::string::string((string *)&local_1e0,"",(allocator *)&local_110);
  Write<double>::Write(&weights,LVar7,(string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  Adj::Adj(&func.surf_verts2tris,surf_verts2tris);
  Write<int>::Write(&func.tri2surf_tri.write_,&tri2surf_tri->write_);
  Write<double>::Write(&func.weights,&weights);
  Write<int>::Write(&func.fv2v.write_,&fv2v.write_);
  Write<double>::Write(&func.coords.write_,&coords.write_);
  Adj::Adj(&local_110,&func.surf_verts2tris);
  Write<int>::Write(&local_e0,&func.tri2surf_tri.write_);
  Write<double>::Write(&local_d0,&func.weights);
  Write<int>::Write(&local_c0,&func.fv2v.write_);
  Write<double>::Write(&local_b0,&func.coords.write_);
  if (0 < (int)local_2a0) {
    entering_parallel = 1;
    Adj::Adj(&local_1e0,&local_110);
    Write<int>::Write(&local_1b0,&local_e0);
    Write<double>::Write(&local_1a0,(Write<signed_char> *)&local_d0);
    Write<int>::Write(&local_190,&local_c0);
    Write<double>::Write(&local_180,(Write<signed_char> *)&local_b0);
    entering_parallel = 0;
    local_2a0 = local_2a0 & 0xffffffff;
    lVar3 = 1;
    for (uVar12 = 0; uVar12 != local_2a0; uVar12 = uVar12 + 1) {
      psVar8 = (pointer)local_1e0.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
      for (lVar11 = (long)*(int *)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                            *)local_1e0.super_Graph.a2ab.write_.shared_alloc_.
                                              direct_ptr)->_M_ptr + uVar12 * 4);
          lVar11 < *(int *)((long)&(psVar8->
                                   super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr + uVar12 * 4 + 4); lVar11 = lVar11 + 1) {
        iVar2 = *(int *)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *
                                 )local_1e0.super_Graph.ab2b.write_.shared_alloc_.direct_ptr)->
                                _M_ptr + lVar11 * 4);
        if (*(int *)((long)(_func_int ***)local_1b0.shared_alloc_.direct_ptr + (long)iVar2 * 4) < 0)
        {
          ((_func_int ***)local_1a0.shared_alloc_.direct_ptr)[lVar11] = (_func_int **)0x0;
        }
        else {
          cVar1 = *(char *)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                     *)local_1e0.codes.write_.shared_alloc_.direct_ptr)->_M_ptr +
                           lVar11);
          for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
            *(undefined4 *)
             ((long)ffv2p.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_ +
             lVar9 * 4) = *(undefined4 *)
                           ((long)(_func_int ***)local_190.shared_alloc_.direct_ptr +
                           lVar9 * 4 + (long)(iVar2 * 3) * 4);
          }
          local_1f0 = (pointer)ffv2p.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>
                               .array_[0];
          local_1e8 = ffv2p.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_
                      [1]._0_4_;
          for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
            ffv2v.array_[((int)((char)('\x03' - (cVar1 >> 3)) % '\x03') + (int)lVar9) % 3] =
                 *(int *)((long)&local_1f0 + lVar9 * 4);
          }
          local_2b8._8_4_ = ffv2v.array_[2];
          local_2b8._0_4_ = ffv2v.array_[0];
          local_2b8._4_4_ = ffv2v.array_[1];
          for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
            iVar2 = *(int *)(local_2b8 + lVar9 * 4);
            for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
              v.super_Few<double,_3>.array_[lVar10] =
                   (double)((_func_int ***)local_180.shared_alloc_.direct_ptr)[iVar2 * 3 + lVar10];
            }
            ffv2p.super_Few<Omega_h::Vector<3>,_3>.array_[lVar9].super_Few<double,_3>.array_[2] =
                 v.super_Few<double,_3>.array_[2];
            ffv2p.super_Few<Omega_h::Vector<3>,_3>.array_[lVar9].super_Few<double,_3>.array_[0] =
                 v.super_Few<double,_3>.array_[0];
            ffv2p.super_Few<Omega_h::Vector<3>,_3>.array_[lVar9].super_Few<double,_3>.array_[1] =
                 v.super_Few<double,_3>.array_[1];
          }
          lVar9 = 0;
          while (lVar9 != 2) {
            local_288 = ffv2p.super_Few<Omega_h::Vector<3>,_3>.array_[lVar9 + 1].
                        super_Few<double,_3>.array_[2];
            local_298._8_8_ =
                 ffv2p.super_Few<Omega_h::Vector<3>,_3>.array_[lVar9 + 1].super_Few<double,_3>.
                 array_[1];
            local_298._0_8_ =
                 ffv2p.super_Few<Omega_h::Vector<3>,_3>.array_[lVar9 + 1].super_Few<double,_3>.
                 array_[0];
            local_2a8 = ffv2p.super_Few<Omega_h::Vector<3>,_3>.array_[0].super_Few<double,_3>.array_
                        [2];
            for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
              c.super_Few<double,_3>.array_[lVar10] =
                   *(double *)(local_298 + lVar10 * 8) - *(double *)(local_2b8 + lVar10 * 8);
            }
            (&v)[lVar9].super_Few<double,_3>.array_[2] = c.super_Few<double,_3>.array_[2];
            (&v)[lVar9].super_Few<double,_3>.array_[0] = c.super_Few<double,_3>.array_[0];
            (&v)[lVar9].super_Few<double,_3>.array_[1] = c.super_Few<double,_3>.array_[1];
            lVar9 = lVar9 + 1;
          }
          dVar4 = (double)psStack_208 * v.super_Few<double,_3>.array_[1] -
                  v.super_Few<double,_3>.array_[2] * (double)psStack_210;
          dVar5 = (double)local_218 * v.super_Few<double,_3>.array_[2] -
                  v.super_Few<double,_3>.array_[0] * (double)psStack_208;
          uVar13 = SUB84(dVar5,0);
          uVar14 = (undefined4)((ulong)dVar5 >> 0x20);
          local_2a8 = v.super_Few<double,_3>.array_[0] * (double)psStack_210 -
                      (double)local_218 * v.super_Few<double,_3>.array_[1];
          local_2b8._8_4_ = uVar13;
          local_2b8._0_8_ = dVar4;
          local_2b8._12_4_ = uVar14;
          local_298._8_4_ = uVar13;
          local_298._0_8_ = dVar4;
          local_298._12_4_ = uVar14;
          local_288 = local_2a8;
          dVar4 = dVar4 * dVar4;
          for (lVar9 = lVar3; lVar9 != 3; lVar9 = lVar9 + 1) {
            dVar4 = dVar4 + *(double *)(local_298 + lVar9 * 8) * *(double *)(local_2b8 + lVar9 * 8);
          }
          if (dVar4 < 0.0) {
            dVar4 = sqrt(dVar4);
          }
          else {
            dVar4 = SQRT(dVar4);
          }
          local_2a8 = v.super_Few<double,_3>.array_[2];
          local_288 = v.super_Few<double,_3>.array_[2];
          dVar5 = v.super_Few<double,_3>.array_[0] * v.super_Few<double,_3>.array_[0];
          for (lVar9 = lVar3; lVar9 != 3; lVar9 = lVar9 + 1) {
            dVar5 = dVar5 + *(double *)(local_298 + lVar9 * 8) * *(double *)(local_2b8 + lVar9 * 8);
          }
          local_2b8._8_8_ = psStack_210;
          local_2b8._0_8_ = local_218;
          dVar6 = (double)local_218 * (double)local_218;
          for (lVar9 = lVar3; lVar9 != 3; lVar9 = lVar9 + 1) {
            dVar6 = dVar6 + *(double *)(local_298 + lVar9 * 8) * *(double *)(local_2b8 + lVar9 * 8);
          }
          ((_func_int ***)local_1a0.shared_alloc_.direct_ptr)[lVar11] =
               (_func_int **)(dVar4 / (dVar5 * dVar6));
          psVar8 = (pointer)local_1e0.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
        }
      }
    }
    tri_vert_normal_weights(Omega_h::Mesh*,Omega_h::Adj,Omega_h::Read<int>)::$_0::~__0
              ((__0 *)&local_1e0);
  }
  tri_vert_normal_weights(Omega_h::Mesh*,Omega_h::Adj,Omega_h::Read<int>)::$_0::~__0
            ((__0 *)&local_110);
  Write<double>::Write(&local_260,(Write<signed_char> *)&weights);
  Read<double>::Read((Read<signed_char> *)this,(Write<double> *)&local_260);
  Write<double>::~Write((Write<double> *)&local_260);
  tri_vert_normal_weights(Omega_h::Mesh*,Omega_h::Adj,Omega_h::Read<int>)::$_0::~__0((__0 *)&func);
  Write<double>::~Write(&weights);
  Write<double>::~Write(&coords.write_);
  Write<int>::~Write(&fv2v.write_);
  RVar15.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar15.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar15.write_.shared_alloc_;
}

Assistant:

Reals tri_vert_normal_weights(
    Mesh* mesh, Adj surf_verts2tris, LOs tri2surf_tri) {
  auto nsurf_verts = surf_verts2tris.nnodes();
  auto fv2v = mesh->ask_verts_of(FACE);
  auto coords = mesh->coords();
  auto nweights = surf_verts2tris.nedges();
  auto weights = Write<Real>(nweights);
  auto func = OMEGA_H_LAMBDA(LO surf_vert) {
    for (auto vf = surf_verts2tris.a2ab[surf_vert];
         vf < surf_verts2tris.a2ab[surf_vert + 1]; ++vf) {
      auto f = surf_verts2tris.ab2b[vf];
      if (tri2surf_tri[f] < 0) {
        weights[vf] = 0.0;
        continue;
      }
      auto code = surf_verts2tris.codes[vf];
      auto ffv = code_which_down(code);
      auto rot = rotation_to_first(3, ffv);
      auto ffv2v_0 = gather_verts<3>(fv2v, f);
      Few<LO, 3> ffv2v;
      rotate_adj<3>(rot, ffv2v_0, 0, ffv2v, 0);
      auto ffv2p = gather_vectors<3, 3>(coords, ffv2v);
      auto b = simplex_basis<3, 2>(ffv2p);
      auto w =
          norm(cross(b[0], b[1])) / (norm_squared(b[0]) * norm_squared(b[1]));
      weights[vf] = w;
    }
  };
  parallel_for(nsurf_verts, func, "tri_vert_normal_weights");
  return weights;
}